

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__tga_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  uchar uVar1;
  ulong __n;
  bool bVar2;
  stbi_uc *psVar3;
  stbi_uc sVar4;
  byte bVar5;
  stbi_uc sVar6;
  stbi_uc sVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  bool bVar17;
  int iVar18;
  char *pcVar19;
  stbi_uc *data;
  stbi_uc *out;
  uint uVar20;
  uint uVar21;
  uint c;
  uint *puVar22;
  uint uVar23;
  int iVar24;
  uchar *puVar25;
  uint y_00;
  uint uVar26;
  int iVar27;
  int z;
  ulong uVar28;
  long in_FS_OFFSET;
  bool bVar29;
  bool bVar30;
  uchar raw_data [4];
  uint local_7c;
  stbi_uc local_64 [4];
  stbi_uc *local_60;
  uint *local_58;
  uint local_4c;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  local_58 = (uint *)x;
  local_4c = req_comp;
  sVar4 = stbi__get8(s);
  local_60 = (stbi_uc *)CONCAT71(local_60._1_7_,sVar4);
  sVar4 = stbi__get8(s);
  bVar5 = stbi__get8(s);
  sVar6 = stbi__get8(s);
  sVar7 = stbi__get8(s);
  bVar8 = stbi__get8(s);
  bVar9 = stbi__get8(s);
  bVar10 = stbi__get8(s);
  stbi__get8(s);
  stbi__get8(s);
  stbi__get8(s);
  stbi__get8(s);
  bVar11 = stbi__get8(s);
  bVar12 = stbi__get8(s);
  bVar13 = stbi__get8(s);
  bVar14 = stbi__get8(s);
  bVar15 = stbi__get8(s);
  bVar16 = stbi__get8(s);
  local_64[0] = '\0';
  local_64[1] = '\0';
  local_64[2] = '\0';
  local_64[3] = '\0';
  if (sVar4 == '\0') {
    if (bVar15 < 0x10) {
      if (bVar15 == 8) {
LAB_001380a6:
        bVar30 = true;
        bVar2 = false;
        bVar10 = 1;
        goto LAB_001380d7;
      }
      if (bVar15 == 0xf) goto LAB_00138094;
    }
    else {
      bVar10 = bVar15;
      if ((bVar15 == 0x20) || (bVar15 == 0x18)) goto LAB_001380c6;
      if (bVar15 == 0x10) {
        uVar21 = bVar5 - 8;
        if (bVar5 < 8) {
          uVar21 = (uint)bVar5;
        }
        if (uVar21 != 3) goto LAB_00138094;
        bVar10 = 2;
        goto LAB_001380c9;
      }
    }
LAB_001380b8:
    pcVar19 = "bad format";
    goto LAB_001382da;
  }
  uVar21 = (uint)bVar10;
  if (uVar21 < 0x18) {
    if (1 < uVar21 - 0xf) {
      if (uVar21 == 8) goto LAB_001380a6;
      goto LAB_001380b8;
    }
LAB_00138094:
    bVar10 = 3;
    bVar2 = true;
    bVar30 = false;
  }
  else {
    if ((uVar21 != 0x18) && (uVar21 != 0x20)) goto LAB_001380b8;
LAB_001380c6:
    bVar10 = bVar10 >> 3;
LAB_001380c9:
    bVar30 = true;
    bVar2 = false;
  }
LAB_001380d7:
  local_38 = (ulong)bVar11;
  uVar21 = (uint)bVar11 + (uint)bVar12 * 0x100;
  local_40 = (ulong)bVar13;
  local_48 = (ulong)bVar14 << 8;
  y_00 = (int)local_48 + (uint)bVar13;
  c = (uint)bVar10;
  *local_58 = uVar21;
  *y = y_00;
  if (comp != (int *)0x0) {
    *comp = c;
  }
  iVar18 = stbi__mad3sizes_valid(uVar21,y_00,c,0);
  if (iVar18 == 0) {
    pcVar19 = "too large";
    goto LAB_001382da;
  }
  data = (stbi_uc *)stbi__malloc_mad3(uVar21,y_00,c,0);
  if (data == (uchar *)0x0) {
LAB_001382d3:
    pcVar19 = "outofmem";
    goto LAB_001382da;
  }
  stbi__skip(s,(uint)(byte)local_60);
  if ((bVar5 < 8 && sVar4 == '\0') && !bVar2) {
    if (y_00 != 0) {
      iVar18 = (int)local_48 + (int)local_40;
      iVar27 = 0;
      do {
        iVar18 = iVar18 + -1;
        iVar24 = iVar27;
        if ((bVar16 >> 5 & 1) == 0) {
          iVar24 = iVar18;
        }
        stbi__getn(s,data + (int)(iVar24 * uVar21 * c),uVar21 * c);
        iVar27 = iVar27 + 1;
      } while (iVar18 != 0);
    }
    goto LAB_00138519;
  }
  uVar26 = (uint)bVar9 * 0x100 + (uint)bVar8;
  if (sVar4 == '\0') {
    local_60 = (stbi_uc *)0x0;
    psVar3 = local_60;
  }
  else {
    if (uVar26 == 0) {
LAB_001382bb:
      free(data);
      pcVar19 = "bad palette";
LAB_001382da:
      *(char **)(in_FS_OFFSET + -0x10) = pcVar19;
      return (void *)0x0;
    }
    stbi__skip(s,(uint)CONCAT11(sVar7,sVar6));
    out = (stbi_uc *)stbi__malloc_mad2(uVar26,c,0);
    if (out == (stbi_uc *)0x0) {
      free(data);
      goto LAB_001382d3;
    }
    if (bVar30) {
      iVar18 = stbi__getn(s,out,uVar26 * c);
      psVar3 = out;
      if (iVar18 == 0) {
        free(data);
        data = out;
        goto LAB_001382bb;
      }
    }
    else {
      uVar20 = (uint)CONCAT11(bVar9,bVar8);
      local_60 = out;
      do {
        stbi__tga_read_rgb16(s,out);
        out = out + c;
        uVar20 = uVar20 - 1;
        psVar3 = local_60;
      } while (uVar20 != 0);
    }
  }
  local_60 = psVar3;
  if (y_00 * uVar21 != 0) {
    __n = (ulong)c;
    local_58 = (uint *)(ulong)(y_00 * uVar21);
    bVar17 = true;
    puVar22 = (uint *)0x0;
    local_7c = 0;
    iVar18 = 0;
    do {
      if (bVar5 < 8) {
LAB_001383a7:
        if (sVar4 == '\0') {
          if (bVar30) {
            if (c == 0) goto LAB_0013846d;
            uVar28 = 0;
            do {
              sVar6 = stbi__get8(s);
              local_64[uVar28] = sVar6;
              uVar28 = uVar28 + 1;
            } while (__n != uVar28);
          }
          else {
            stbi__tga_read_rgb16(s,local_64);
          }
          goto LAB_00138450;
        }
        bVar8 = stbi__get8(s);
        uVar20 = (uint)bVar8;
        if (bVar15 != 8) {
          sVar6 = stbi__get8(s);
          uVar20 = (uint)CONCAT11(sVar6,bVar8);
        }
        if (c != 0) {
          if (uVar26 <= uVar20) {
            uVar20 = 0;
          }
          memcpy(local_64,local_60 + uVar20 * c,__n);
          goto LAB_00138454;
        }
      }
      else {
        if (iVar18 == 0) {
          bVar8 = stbi__get8(s);
          iVar18 = (bVar8 & 0x7f) + 1;
          local_7c = (uint)(bVar8 >> 7);
          goto LAB_001383a7;
        }
        bVar29 = local_7c != 0;
        local_7c = 1;
        if (!bVar29 || bVar17) {
          local_7c = (uint)bVar29;
          goto LAB_001383a7;
        }
LAB_00138450:
        if (c != 0) {
LAB_00138454:
          memcpy(data + c * (int)puVar22,local_64,__n);
        }
      }
LAB_0013846d:
      iVar18 = iVar18 + -1;
      puVar22 = (uint *)((long)puVar22 + 1);
      bVar17 = false;
    } while (puVar22 != local_58);
  }
  if (y_00 != 0 && (bVar16 >> 5 & 1) == 0) {
    iVar18 = uVar21 * c;
    uVar20 = ((int)local_40 + (int)local_48) - 1;
    iVar27 = ((uint)bVar12 * 0x100 | (uint)local_38) * uVar20 * c;
    uVar23 = 0;
    uVar26 = 0;
    do {
      if (iVar18 != 0) {
        puVar25 = data;
        iVar24 = iVar18 + 1;
        do {
          uVar1 = puVar25[uVar23];
          puVar25[uVar23] = puVar25[iVar27];
          puVar25[iVar27] = uVar1;
          puVar25 = puVar25 + 1;
          iVar24 = iVar24 + -1;
        } while (1 < iVar24);
      }
      iVar27 = iVar27 - iVar18;
      uVar23 = uVar23 + iVar18;
      bVar30 = uVar26 != uVar20 >> 1;
      uVar26 = uVar26 + 1;
    } while (bVar30);
  }
  if (local_60 != (stbi_uc *)0x0) {
    free(local_60);
  }
LAB_00138519:
  if ((!bVar2 && 2 < bVar10) && (iVar18 = y_00 * uVar21, iVar18 != 0)) {
    puVar25 = data + 2;
    do {
      uVar1 = puVar25[-2];
      puVar25[-2] = *puVar25;
      *puVar25 = uVar1;
      puVar25 = puVar25 + c;
      iVar18 = iVar18 + -1;
    } while (iVar18 != 0);
  }
  if (c == local_4c || local_4c == 0) {
    return data;
  }
  puVar25 = stbi__convert_format(data,c,local_4c,uVar21,y_00);
  return puVar25;
}

Assistant:

static void *stbi__tga_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   //   read in the TGA header stuff
   int tga_offset = stbi__get8(s);
   int tga_indexed = stbi__get8(s);
   int tga_image_type = stbi__get8(s);
   int tga_is_RLE = 0;
   int tga_palette_start = stbi__get16le(s);
   int tga_palette_len = stbi__get16le(s);
   int tga_palette_bits = stbi__get8(s);
   int tga_x_origin = stbi__get16le(s);
   int tga_y_origin = stbi__get16le(s);
   int tga_width = stbi__get16le(s);
   int tga_height = stbi__get16le(s);
   int tga_bits_per_pixel = stbi__get8(s);
   int tga_comp, tga_rgb16=0;
   int tga_inverted = stbi__get8(s);
   // int tga_alpha_bits = tga_inverted & 15; // the 4 lowest bits - unused (useless?)
   //   image data
   unsigned char *tga_data;
   unsigned char *tga_palette = NULL;
   int i, j;
   unsigned char raw_data[4] = {0};
   int RLE_count = 0;
   int RLE_repeating = 0;
   int read_next_pixel = 1;
   STBI_NOTUSED(ri);
   STBI_NOTUSED(tga_x_origin); // @TODO
   STBI_NOTUSED(tga_y_origin); // @TODO

   if (tga_height > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");
   if (tga_width > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");

   //   do a tiny bit of precessing
   if ( tga_image_type >= 8 )
   {
      tga_image_type -= 8;
      tga_is_RLE = 1;
   }
   tga_inverted = 1 - ((tga_inverted >> 5) & 1);

   //   If I'm paletted, then I'll use the number of bits from the palette
   if ( tga_indexed ) tga_comp = stbi__tga_get_comp(tga_palette_bits, 0, &tga_rgb16);
   else tga_comp = stbi__tga_get_comp(tga_bits_per_pixel, (tga_image_type == 3), &tga_rgb16);

   if(!tga_comp) // shouldn't really happen, stbi__tga_test() should have ensured basic consistency
      return stbi__errpuc("bad format", "Can't find out TGA pixelformat");

   //   tga info
   *x = tga_width;
   *y = tga_height;
   if (comp) *comp = tga_comp;

   if (!stbi__mad3sizes_valid(tga_width, tga_height, tga_comp, 0))
      return stbi__errpuc("too large", "Corrupt TGA");

   tga_data = (unsigned char*)stbi__malloc_mad3(tga_width, tga_height, tga_comp, 0);
   if (!tga_data) return stbi__errpuc("outofmem", "Out of memory");

   // skip to the data's starting position (offset usually = 0)
   stbi__skip(s, tga_offset );

   if ( !tga_indexed && !tga_is_RLE && !tga_rgb16 ) {
      for (i=0; i < tga_height; ++i) {
         int row = tga_inverted ? tga_height -i - 1 : i;
         stbi_uc *tga_row = tga_data + row*tga_width*tga_comp;
         stbi__getn(s, tga_row, tga_width * tga_comp);
      }
   } else  {
      //   do I need to load a palette?
      if ( tga_indexed)
      {
         if (tga_palette_len == 0) {  /* you have to have at least one entry! */
            STBI_FREE(tga_data);
            return stbi__errpuc("bad palette", "Corrupt TGA");
         }

         //   any data to skip? (offset usually = 0)
         stbi__skip(s, tga_palette_start );
         //   load the palette
         tga_palette = (unsigned char*)stbi__malloc_mad2(tga_palette_len, tga_comp, 0);
         if (!tga_palette) {
            STBI_FREE(tga_data);
            return stbi__errpuc("outofmem", "Out of memory");
         }
         if (tga_rgb16) {
            stbi_uc *pal_entry = tga_palette;
            STBI_ASSERT(tga_comp == STBI_rgb);
            for (i=0; i < tga_palette_len; ++i) {
               stbi__tga_read_rgb16(s, pal_entry);
               pal_entry += tga_comp;
            }
         } else if (!stbi__getn(s, tga_palette, tga_palette_len * tga_comp)) {
               STBI_FREE(tga_data);
               STBI_FREE(tga_palette);
               return stbi__errpuc("bad palette", "Corrupt TGA");
         }
      }
      //   load the data
      for (i=0; i < tga_width * tga_height; ++i)
      {
         //   if I'm in RLE mode, do I need to get a RLE stbi__pngchunk?
         if ( tga_is_RLE )
         {
            if ( RLE_count == 0 )
            {
               //   yep, get the next byte as a RLE command
               int RLE_cmd = stbi__get8(s);
               RLE_count = 1 + (RLE_cmd & 127);
               RLE_repeating = RLE_cmd >> 7;
               read_next_pixel = 1;
            } else if ( !RLE_repeating )
            {
               read_next_pixel = 1;
            }
         } else
         {
            read_next_pixel = 1;
         }
         //   OK, if I need to read a pixel, do it now
         if ( read_next_pixel )
         {
            //   load however much data we did have
            if ( tga_indexed )
            {
               // read in index, then perform the lookup
               int pal_idx = (tga_bits_per_pixel == 8) ? stbi__get8(s) : stbi__get16le(s);
               if ( pal_idx >= tga_palette_len ) {
                  // invalid index
                  pal_idx = 0;
               }
               pal_idx *= tga_comp;
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = tga_palette[pal_idx+j];
               }
            } else if(tga_rgb16) {
               STBI_ASSERT(tga_comp == STBI_rgb);
               stbi__tga_read_rgb16(s, raw_data);
            } else {
               //   read in the data raw
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = stbi__get8(s);
               }
            }
            //   clear the reading flag for the next pixel
            read_next_pixel = 0;
         } // end of reading a pixel

         // copy data
         for (j = 0; j < tga_comp; ++j)
           tga_data[i*tga_comp+j] = raw_data[j];

         //   in case we're in RLE mode, keep counting down
         --RLE_count;
      }
      //   do I need to invert the image?
      if ( tga_inverted )
      {
         for (j = 0; j*2 < tga_height; ++j)
         {
            int index1 = j * tga_width * tga_comp;
            int index2 = (tga_height - 1 - j) * tga_width * tga_comp;
            for (i = tga_width * tga_comp; i > 0; --i)
            {
               unsigned char temp = tga_data[index1];
               tga_data[index1] = tga_data[index2];
               tga_data[index2] = temp;
               ++index1;
               ++index2;
            }
         }
      }
      //   clear my palette, if I had one
      if ( tga_palette != NULL )
      {
         STBI_FREE( tga_palette );
      }
   }

   // swap RGB - if the source data was RGB16, it already is in the right order
   if (tga_comp >= 3 && !tga_rgb16)
   {
      unsigned char* tga_pixel = tga_data;
      for (i=0; i < tga_width * tga_height; ++i)
      {
         unsigned char temp = tga_pixel[0];
         tga_pixel[0] = tga_pixel[2];
         tga_pixel[2] = temp;
         tga_pixel += tga_comp;
      }
   }

   // convert to target component count
   if (req_comp && req_comp != tga_comp)
      tga_data = stbi__convert_format(tga_data, tga_comp, req_comp, tga_width, tga_height);

   //   the things I do to get rid of an error message, and yet keep
   //   Microsoft's C compilers happy... [8^(
   tga_palette_start = tga_palette_len = tga_palette_bits =
         tga_x_origin = tga_y_origin = 0;
   STBI_NOTUSED(tga_palette_start);
   //   OK, done
   return tga_data;
}